

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_smax16_riscv32(void *d,void *a,void *b,uint32_t desc)

{
  short sVar1;
  intptr_t oprsz_00;
  int16_t dd;
  int16_t bb;
  long lStack_38;
  int16_t aa;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *b_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (lStack_38 = 0; lStack_38 < oprsz_00; lStack_38 = lStack_38 + 2) {
    sVar1 = *(short *)((long)b + lStack_38);
    if (sVar1 < *(short *)((long)a + lStack_38)) {
      sVar1 = *(short *)((long)a + lStack_38);
    }
    *(short *)((long)d + lStack_38) = sVar1;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_smax16)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int16_t)) {
        int16_t aa = *(int16_t *)((char *)a + i);
        int16_t bb = *(int16_t *)((char *)b + i);
        int16_t dd = aa > bb ? aa : bb;
        *(int16_t *)((char *)d + i) = dd;
    }
    clear_high(d, oprsz, desc);
}